

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_tree.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  double dVar3;
  string t1_unrooted_newick;
  PhyloTree t1_r_as_u;
  PhyloTree t1;
  string t2_unrooted_newick;
  string t1_rooted_newick;
  string n2;
  string n1;
  string t2_rooted_newick;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> p_unrooted;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> p_rooted;
  PhyloTree t1_unrooted;
  PhyloTree t1_rooted;
  PhyloTree t1_u_as_r;
  PhyloTree t2_unrooted_pruned;
  PhyloTree t1_unrooted_pruned;
  PhyloTree t2_rooted_pruned;
  PhyloTree t1_rooted_pruned;
  PhyloTree t2_unrooted;
  PhyloTree t2_rooted;
  PhyloTree t2;
  undefined1 *local_750;
  long local_748;
  undefined1 local_740 [16];
  PhyloTree local_730;
  string local_6c8;
  PhyloTree local_6a8;
  undefined1 *local_640;
  long local_638;
  undefined1 local_630 [16];
  undefined1 *local_620;
  long local_618;
  undefined1 local_610 [16];
  undefined1 *local_600;
  long local_5f8;
  undefined1 local_5f0 [16];
  undefined1 *local_5e0;
  long local_5d8;
  undefined1 local_5d0 [16];
  undefined1 *local_5c0;
  long local_5b8;
  undefined1 local_5b0 [16];
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> local_4a0;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> local_470;
  PhyloTree local_440;
  PhyloTree local_3d8;
  PhyloTree local_370;
  PhyloTree local_308;
  PhyloTree local_2a0;
  PhyloTree local_238;
  PhyloTree local_1d0;
  PhyloTree local_168;
  PhyloTree local_100;
  PhyloTree local_98;
  
  local_620 = local_610;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_620,
             "((((a:0.0589988989102,(b:0.0418326893396,c:0.859140507521):2.61261891006):0.990549866809,(d:4.14397236141,f:0.17088326593):0.0323075746352):2.02262974527,g:0.693675923359):0.428536225039,(i:1.69919541269,j:0.362508537093):0.195899634738):0.0;"
             ,"");
  local_5c0 = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5c0,
             "((a:2.03481158672,((b:0.374332029372,c:3.8377563921):0.258935532423,((e:2.18939751337,f:2.17982498905):0.623171789534,g:0.12443873179):0.845298009923):0.0780727161207):0.271887473804,(h:0.125928604756,j:0.64774830898):0.240154552836):0.0;"
             ,"");
  local_750 = local_740;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_750,
             "((((a:0.0589988989102,(b:0.0418326893396,c:0.859140507521):2.61261891006):0.990549866809,(d:4.14397236141,f:0.17088326593):0.0323075746352):2.02262974527,g:0.693675923359):0.624435859777,i:1.69919541269,j:0.362508537093):0.0;"
             ,"");
  local_640 = local_630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_640,
             "((a:2.03481158672,((b:0.374332029372,c:3.8377563921):0.258935532423,((e:2.18939751337,f:2.17982498905):0.623171789534,g:0.12443873179):0.845298009923):0.0780727161207):0.51204202664,h:0.125928604756,j:0.64774830898):0.0;"
             ,"");
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_4c0,local_620,local_620 + local_618);
  PhyloTree::PhyloTree(&local_3d8,&local_4c0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p);
  }
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_4e0,local_750,local_750 + local_748);
  PhyloTree::PhyloTree(&local_440,&local_4e0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p);
  }
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_500,local_5c0,local_5c0 + local_5b8);
  PhyloTree::PhyloTree(&local_100,&local_500,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_520,local_640,local_640 + local_638);
  PhyloTree::PhyloTree(&local_168,&local_520,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p);
  }
  PhyloTree::leaf_difference(&local_470,&local_3d8,&local_100);
  PhyloTree::PhyloTree(&local_1d0,&local_3d8,&local_470.first);
  PhyloTree::PhyloTree(&local_238,&local_100,&local_470.first);
  PhyloTree::leaf_difference(&local_4a0,&local_440,&local_168);
  PhyloTree::PhyloTree(&local_2a0,&local_440,&local_4a0.first);
  PhyloTree::PhyloTree(&local_308,&local_168,&local_4a0.first);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"T1 rooted: ",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_730.newick,&local_3d8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_730.newick._M_dataplus._M_p,local_730.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  paVar1 = &local_730.newick.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_730.newick._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"T1 unrooted: ",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_730.newick,&local_440);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_730.newick._M_dataplus._M_p,local_730.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_730.newick._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"T2 rooted: ",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_730.newick,&local_100);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_730.newick._M_dataplus._M_p,local_730.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_730.newick._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"T2 unrooted: ",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_730.newick,&local_168);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_730.newick._M_dataplus._M_p,local_730.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_730.newick._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"T1 rooted,pruned: ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_730.newick,&local_1d0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_730.newick._M_dataplus._M_p,local_730.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_730.newick._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"T1 unrooted,pruned: ",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_730.newick,&local_2a0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_730.newick._M_dataplus._M_p,local_730.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_730.newick._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"T2 rooted,pruned: ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_730.newick,&local_238);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_730.newick._M_dataplus._M_p,local_730.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_730.newick._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"T2 unrooted,pruned: ",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_730.newick,&local_308);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_730.newick._M_dataplus._M_p,local_730.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_730.newick._M_dataplus._M_p);
  }
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_540,local_620,local_620 + local_618);
  PhyloTree::PhyloTree(&local_730,&local_540,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p);
  }
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_560,local_750,local_750 + local_748);
  PhyloTree::PhyloTree(&local_370,&local_560,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"T1 rooted as unrooted: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_6a8.newick,&local_730);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_6a8.newick._M_dataplus._M_p,local_6a8.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  paVar1 = &local_6a8.newick.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_6a8.newick._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"T1 unrooted as rooted: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_6a8.newick,&local_370);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_6a8.newick._M_dataplus._M_p,local_6a8.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_6a8.newick._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"T1 rooted: ",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_6a8.newick,&local_3d8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_6a8.newick._M_dataplus._M_p,local_6a8.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_6a8.newick._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"T1 unrooted: ",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar2 = (ostream *)std::ostream::flush();
  PhyloTree::toString_abi_cxx11_(&local_6a8.newick,&local_440);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_6a8.newick._M_dataplus._M_p,local_6a8.newick._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8.newick._M_dataplus._M_p != paVar1) {
    operator_delete(local_6a8.newick._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Distance: ",10);
  dVar3 = Distance::getGeodesicDistance(&local_730,&local_3d8,false);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Distance: ",10);
  dVar3 = Distance::getGeodesicDistance(&local_730,&local_440,false);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Distance: ",10);
  dVar3 = Distance::getGeodesicDistance(&local_370,&local_3d8,false);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Distance: ",10);
  dVar3 = Distance::getGeodesicDistance(&local_370,&local_440,false);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rooted, pruned distance: ",0x19);
  dVar3 = Distance::getGeodesicDistance(&local_1d0,&local_238,false);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"unrooted, pruned distance: ",0x1b);
  dVar3 = Distance::getGeodesicDistance(&local_2a0,&local_308,false);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rooted, pruned distance: ",0x19);
  dVar3 = Distance::getRobinsonFouldsDistance(&local_1d0,&local_238,false);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"unrooted, pruned distance: ",0x1b);
  dVar3 = Distance::getRobinsonFouldsDistance(&local_2a0,&local_308,false);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_5e0 = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5e0,"((a:3,b:4):.1,(c:5,((d:6,e:7):.2,f:8):.3):.4);","");
  local_600 = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_600,"((a:3,c:4):.5,(d:5,((b:6,e:7):.2,f:8):.3):.4);","");
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_580,local_5e0,local_5e0 + local_5d8);
  PhyloTree::PhyloTree(&local_6a8,&local_580,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p);
  }
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_5a0,local_600,local_600 + local_5f8);
  PhyloTree::PhyloTree(&local_98,&local_5a0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"t1: ",4);
  PhyloTree::toString_abi_cxx11_(&local_6c8,&local_6a8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_6c8._M_dataplus._M_p,local_6c8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"t2: ",4);
  PhyloTree::toString_abi_cxx11_(&local_6c8,&local_98);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_6c8._M_dataplus._M_p,local_6c8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p);
  }
  dVar3 = Distance::getRobinsonFouldsDistance(&local_6a8,&local_98,false);
  std::ostream::_M_insert<double>(dVar3);
  if (local_98.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_98.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.newick._M_dataplus._M_p != &local_98.newick.field_2) {
    operator_delete(local_98.newick._M_dataplus._M_p);
  }
  if (local_6a8.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6a8.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6a8.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_6a8.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8.newick._M_dataplus._M_p != &local_6a8.newick.field_2) {
    operator_delete(local_6a8.newick._M_dataplus._M_p);
  }
  if (local_600 != local_5f0) {
    operator_delete(local_600);
  }
  if (local_5e0 != local_5d0) {
    operator_delete(local_5e0);
  }
  if (local_370.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_370.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_370.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_370.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.newick._M_dataplus._M_p != &local_370.newick.field_2) {
    operator_delete(local_370.newick._M_dataplus._M_p);
  }
  if (local_730.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_730.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_730.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_730.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.newick._M_dataplus._M_p != &local_730.newick.field_2) {
    operator_delete(local_730.newick._M_dataplus._M_p);
  }
  if (local_308.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_308.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_308.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.newick._M_dataplus._M_p != &local_308.newick.field_2) {
    operator_delete(local_308.newick._M_dataplus._M_p);
  }
  if (local_2a0.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a0.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_2a0.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.newick._M_dataplus._M_p != &local_2a0.newick.field_2) {
    operator_delete(local_2a0.newick._M_dataplus._M_p);
  }
  if (local_4a0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_4a0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4a0.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4a0.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_238.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_238.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.newick._M_dataplus._M_p != &local_238.newick.field_2) {
    operator_delete(local_238.newick._M_dataplus._M_p);
  }
  if (local_1d0.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_1d0.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.newick._M_dataplus._M_p != &local_1d0.newick.field_2) {
    operator_delete(local_1d0.newick._M_dataplus._M_p);
  }
  if (local_470.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_470.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_470.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_470.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_168.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_168.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.newick._M_dataplus._M_p != &local_168.newick.field_2) {
    operator_delete(local_168.newick._M_dataplus._M_p);
  }
  if (local_100.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_100.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.newick._M_dataplus._M_p != &local_100.newick.field_2) {
    operator_delete(local_100.newick._M_dataplus._M_p);
  }
  if (local_440.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_440.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_440.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_440.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440.newick._M_dataplus._M_p != &local_440.newick.field_2) {
    operator_delete(local_440.newick._M_dataplus._M_p);
  }
  if (local_3d8.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d8.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_3d8.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.newick._M_dataplus._M_p != &local_3d8.newick.field_2) {
    operator_delete(local_3d8.newick._M_dataplus._M_p);
  }
  if (local_640 != local_630) {
    operator_delete(local_640);
  }
  if (local_750 != local_740) {
    operator_delete(local_750);
  }
  if (local_5c0 != local_5b0) {
    operator_delete(local_5c0);
  }
  if (local_620 != local_610) {
    operator_delete(local_620);
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[]) {
//    string bignewick1("((a:1,b:2):3,(c:4,d:5):6,(e:7,f:8):9);");
//    string bignewick2("((a:1,(b:2,c:3):4):5,(d:6,e:7):8,f:9);");
//    string smallnewick1("((a:1,b:2):3,c:10,f:17);");
//    string smallnewick2("(a:1,(b:2,c:3):4,f:14);");
    string t1_rooted_newick("((((a:0.0589988989102,(b:0.0418326893396,c:0.859140507521):2.61261891006):0.990549866809,(d:4.14397236141,f:0.17088326593):0.0323075746352):2.02262974527,g:0.693675923359):0.428536225039,(i:1.69919541269,j:0.362508537093):0.195899634738):0.0;");
    string t2_rooted_newick("((a:2.03481158672,((b:0.374332029372,c:3.8377563921):0.258935532423,((e:2.18939751337,f:2.17982498905):0.623171789534,g:0.12443873179):0.845298009923):0.0780727161207):0.271887473804,(h:0.125928604756,j:0.64774830898):0.240154552836):0.0;");
    string t1_unrooted_newick("((((a:0.0589988989102,(b:0.0418326893396,c:0.859140507521):2.61261891006):0.990549866809,(d:4.14397236141,f:0.17088326593):0.0323075746352):2.02262974527,g:0.693675923359):0.624435859777,i:1.69919541269,j:0.362508537093):0.0;");
    string t2_unrooted_newick("((a:2.03481158672,((b:0.374332029372,c:3.8377563921):0.258935532423,((e:2.18939751337,f:2.17982498905):0.623171789534,g:0.12443873179):0.845298009923):0.0780727161207):0.51204202664,h:0.125928604756,j:0.64774830898):0.0;");
//    PhyloTree bigtree1(bignewick1, false);
//    PhyloTree bigtree2(bignewick2, false);
//    PhyloTree smalltree1(smallnewick1, false);
//    PhyloTree smalltree2(smallnewick2, false);
//    PhyloTree prunedtree1(bigtree1, std::vector<int>{3,4});
//    PhyloTree prunedtree2(bigtree2, std::vector<int>{3,4});
    PhyloTree t1_rooted(t1_rooted_newick, true);
    PhyloTree t1_unrooted(t1_unrooted_newick, false);
    PhyloTree t2_rooted(t2_rooted_newick, true);
    PhyloTree t2_unrooted(t2_unrooted_newick, false);
    auto p_rooted = t1_rooted.leaf_difference(t2_rooted);
    PhyloTree t1_rooted_pruned(t1_rooted, p_rooted.first);
    PhyloTree t2_rooted_pruned(t2_rooted, p_rooted.first);
    auto p_unrooted = t1_unrooted.leaf_difference(t2_unrooted);
    PhyloTree t1_unrooted_pruned(t1_unrooted, p_unrooted.first);
    PhyloTree t2_unrooted_pruned(t2_unrooted, p_unrooted.first);
    cout << "T1 rooted: " << endl << t1_rooted.toString() << endl;
    cout << "T1 unrooted: " << endl << t1_unrooted.toString() << endl;
    cout << "T2 rooted: " << endl << t2_rooted.toString() << endl;
    cout << "T2 unrooted: " << endl << t2_unrooted.toString() << endl;
    cout << "T1 rooted,pruned: " << endl << t1_rooted_pruned.toString() << endl;
    cout << "T1 unrooted,pruned: " << endl << t1_unrooted_pruned.toString() << endl;
    cout << "T2 rooted,pruned: " << endl << t2_rooted_pruned.toString() << endl;
    cout << "T2 unrooted,pruned: " << endl << t2_unrooted_pruned.toString() << endl;

    PhyloTree t1_r_as_u(t1_rooted_newick, false);
    PhyloTree t1_u_as_r(t1_unrooted_newick, true);

    cout << "T1 rooted as unrooted: " << endl << t1_r_as_u.toString() << endl;
    cout << "T1 unrooted as rooted: " << endl << t1_u_as_r.toString() << endl;
    cout << "T1 rooted: " << endl << t1_rooted.toString() << endl;
    cout << "T1 unrooted: " << endl << t1_unrooted.toString() << endl;
    cout << "Distance: " << Distance::getGeodesicDistance(t1_r_as_u, t1_rooted, false) << endl;
    cout << "Distance: " << Distance::getGeodesicDistance(t1_r_as_u, t1_unrooted, false) << endl;
    cout << "Distance: " << Distance::getGeodesicDistance(t1_u_as_r, t1_rooted, false) << endl;
    cout << "Distance: " << Distance::getGeodesicDistance(t1_u_as_r, t1_unrooted, false) << endl;
//
//    cout << Distance::getGeodesicDistance(smalltree1, smalltree2, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree1, prunedtree2, false) << endl;
//    cout << Distance::getGeodesicDistance(smalltree1, prunedtree2, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree1, smalltree2, false) << endl;
//    cout << Distance::getGeodesicDistance(smalltree1, smalltree1, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree1, prunedtree1, false) << endl;
//    cout << Distance::getGeodesicDistance(smalltree1, prunedtree1, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree1, smalltree1, false) << endl;
//    cout << Distance::getGeodesicDistance(smalltree2, smalltree2, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree2, prunedtree2, false) << endl;
//    cout << Distance::getGeodesicDistance(smalltree2, prunedtree2, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree2, smalltree2, false) << endl;

//    cout << "TESTING" << endl;
//    try {
//        auto rooted_dist = Distance::getGeodesicDistance(t1_rooted, t2_rooted, false);
//        cout << "rooted distance: " << rooted_dist << endl;
//    } catch (std::invalid_argument e) {
//        cout << e.what() << endl;
//    }
//
//    try {
//        cout << "unrooted distance: " << Distance::getGeodesicDistance(t1_unrooted, t2_unrooted, false) << endl;
//    } catch (std::invalid_argument e) {
//        cout << e.what() << endl;
//    }
//
    cout << "rooted, pruned distance: " << Distance::getGeodesicDistance(t1_rooted_pruned, t2_rooted_pruned, false) << endl;
    cout << "unrooted, pruned distance: " << Distance::getGeodesicDistance(t1_unrooted_pruned, t2_unrooted_pruned, false) << endl;
    cout << "rooted, pruned distance: " << Distance::getRobinsonFouldsDistance(t1_rooted_pruned, t2_rooted_pruned, false) << endl;
    cout << "unrooted, pruned distance: " << Distance::getRobinsonFouldsDistance(t1_unrooted_pruned, t2_unrooted_pruned, false) << endl;


    string n1("((a:3,b:4):.1,(c:5,((d:6,e:7):.2,f:8):.3):.4);");
    string n2("((a:3,c:4):.5,(d:5,((b:6,e:7):.2,f:8):.3):.4);");
    PhyloTree t1(n1, true);
    PhyloTree t2(n2, true);
    cout << "t1: " << t1.toString() << endl;
    cout << "t2: " << t2.toString() << endl;
    cout << Distance::getRobinsonFouldsDistance(t1,t2,false);
//    auto res = bigtree1.leaf_difference(smalltree2);
//    Tools::vector_print(res.first.begin(), res.first.end());
//    Tools::vector_print(res.second.begin(), res.second.end());
//    PhyloTreeEdge e(s1);
//    std::cout << e.toString() << std::endl;
//    PhyloTree t(tree, false);
//    for (auto &edge : t.getEdges()) {
//        std::cout << edge.toString() << std::endl;
//        std::cout << edge.getLength() << std::endl;
//        std::cout << "ID: " << edge.getOriginalID() <<std::endl;
//    }
//
//    for (auto len : t.getLeafEdgeLengths()) {
//        std::cout << len << std::endl;
//    }
//
//    PhyloTree bt(bigtree, false);
//    for (auto &edge : bt.getEdges()) {
//        std::cout << edge.toString() << std::endl;
//        std::cout << edge.getLength() << std::endl;
//        std::cout << "ID: " << edge.getOriginalID() <<std::endl;
//    }
//
//    for (auto len : bt.getLeafEdgeLengths()) {
//        std::cout << len << std::endl;
//    }
//
//    vector<PhyloTreeEdge> ptev;
//    int counter = 0;
//    for (size_t i=0; i < sv.size(); ++i) {
//        PhyloTreeEdge pte(sv[i]);
//        pte.setAttribute(lengths[i]);
//        pte.setOriginalID(counter++);
//        ptev.push_back(pte);
//    }
//    vector<string> leafnames{"a", "b", "c", "f"};
//    PhyloTree pt(ptev, leafnames, lengths);
//
//    for (auto &edge : pt.getEdges()) {
//        std::cout << edge.toString() << std::endl;
//        std::cout << edge.getLength() << std::endl;
//        std::cout << "ID: " << edge.getOriginalID() <<std::endl;
//    }
//
//    std::cout << "Leaf Edge Lengths" << std::endl;
//    for (auto len : pt.getLeafEdgeLengths()) {
//        std::cout << len << std::endl;
//    }

    return 0;
}